

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O0

SeedBuilder * tcu::operator<<(SeedBuilder *builder,float value)

{
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 local_18 [4];
  deUint8 data [4];
  deUint32 val;
  float value_local;
  SeedBuilder *builder_local;
  
  data = (deUint8  [4])value;
  ::deMemcpy(local_18,data,4);
  local_1c = local_18[0];
  local_1b = local_18[1];
  local_1a = local_18[2];
  local_19 = local_18[3];
  SeedBuilder::feed(builder,4,&local_1c);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, float value)
{
	// \note Assume that float has same endianess as uint32.
	deUint32 val;

	deMemcpy(&val, &value, sizeof(deUint32));

	{
		const deUint8	data[]	=
		{
			(deUint8)(val & 0xFFu),
			(deUint8)((val >> 8) & 0xFFu),
			(deUint8)((val >> 16) & 0xFFu),
			(deUint8)((val >> 24) & 0xFFu),
		};

		builder.feed(sizeof(data), data);
		return builder;
	}
}